

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkPrepare(Sfm_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  word *__s;
  Vec_Wec_t *pVVar6;
  sat_solver *s;
  long lVar7;
  long lVar8;
  
  lVar7 = (long)(p->vLevels).nSize;
  if (lVar7 == 0) {
    iVar2 = 0;
  }
  else {
    piVar1 = (p->vLevels).pArray;
    iVar2 = *piVar1;
    for (lVar8 = 1; lVar8 < lVar7; lVar8 = lVar8 + 1) {
      iVar3 = piVar1[lVar8];
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
    }
  }
  p->nLevelMax = iVar2 + p->pPars->nGrowthLevel;
  pVVar4 = Vec_IntAlloc(1000);
  p->vNodes = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  p->vDivs = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p->vRoots = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p->vTfo = pVVar4;
  iVar2 = p->pPars->nWinSizeMax;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar3 = iVar2;
  }
  pVVar5->nCap = iVar3;
  if (iVar3 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar3 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar2;
  memset(__s,0,(long)iVar2 << 3);
  p->vDivCexes = pVVar5;
  pVVar4 = Vec_IntAlloc(100);
  p->vOrder = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  p->vDivVars = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  p->vDivIds = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  p->vLits = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  p->vValues = pVVar4;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  pVVar6->pArray = pVVar4;
  p->vClauses = pVVar6;
  pVVar4 = Vec_IntAlloc(10);
  p->vFaninMap = pVVar4;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,p->pPars->nWinSizeMax);
  return;
}

Assistant:

void Sfm_NtkPrepare( Sfm_Ntk_t * p )
{
    p->nLevelMax = Vec_IntFindMax(&p->vLevels) + p->pPars->nGrowthLevel;
    p->vNodes    = Vec_IntAlloc( 1000 );
    p->vDivs     = Vec_IntAlloc( 100 );
    p->vRoots    = Vec_IntAlloc( 1000 );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vDivCexes = Vec_WrdStart( p->pPars->nWinSizeMax );
    p->vOrder    = Vec_IntAlloc( 100 );
    p->vDivVars  = Vec_IntAlloc( 100 );
    p->vDivIds   = Vec_IntAlloc( 1000 );
    p->vLits     = Vec_IntAlloc( 100 );
    p->vValues   = Vec_IntAlloc( 100 );
    p->vClauses  = Vec_WecAlloc( 100 );
    p->vFaninMap = Vec_IntAlloc( 10 );
    p->pSat      = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->pPars->nWinSizeMax );
}